

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  DHANDLE dhandle;
  
  dhandle = dino_config_start_http
                      ("test_framework","localhost",true,"main",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                       ,0x122);
  _Var1 = dino_http_port(dhandle,0x2378,"main",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                         ,0x122);
  if (_Var1) {
    _Var1 = dino_route_get(dhandle,get_amor,"amor","/","main",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                           ,0x123);
    if (_Var1) {
      _Var1 = dino_route_get(dhandle,get_template_test,"template_test","/template","main",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                             ,0x124);
      if (_Var1) {
        _Var1 = dino_route_get(dhandle,get_sway,"sway","/:wine/:bottle","main",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                               ,0x125);
        if (_Var1) {
          _Var1 = dino_route_post(dhandle,post_main,"main","/","main",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                  ,0x126);
          if (_Var1) {
            _Var1 = dino_route_delete(dhandle,delete_main,"main","/","main",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                      ,0x127);
            if (_Var1) {
              _Var1 = dino_route_put(dhandle,put_main,"main","/","main",
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                     ,0x128);
              if (_Var1) {
                _Var1 = dino_route_options(dhandle,options_main,"main","/","main",
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                           ,0x129);
                if (_Var1) {
                  _Var1 = dino_route_head(dhandle,head_main,"main","/","main",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                          ,0x12a);
                  if (_Var1) {
                    _Var1 = dino_route_trace(dhandle,trace_main,"main","/","main",
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                             ,299);
                    if (_Var1) {
                      dino_route_connect(dhandle,connect_volare,"volare","/","main",
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                         ,300);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  dino_start(dhandle,"main",
             "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
             ,0x12f);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    unsigned short port = 9080;
    char *host = "localhost";
    const char *application_name = "test_framework";

    DINO_CONFIG_START_HTTP(application_name, host, port, true);
        ROUTE_GET(amor, "/")
        ROUTE_GET(template_test, "/template");
        ROUTE_GET(sway, "/:wine/:bottle")
        ROUTE_POST(main, "/")
        ROUTE_DELETE(main, "/")
        ROUTE_PUT(main, "/")
        ROUTE_OPTIONS(main, "/")
        ROUTE_HEAD(main, "/")
        ROUTE_TRACE(main, "/")
        ROUTE_CONNECT(volare, "/")
    DINO_CONFIG_END;

    DINO_START;

    return 0;
}